

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestExtendsImpl::grault(TestExtendsImpl *this,GraultContext context)

{
  Builder builder;
  undefined8 in_stack_ffffffffffffff60;
  Maybe<capnp::MessageSize> local_60;
  Builder local_48;
  CallContextHook *local_20;
  TestExtendsImpl *this_local;
  GraultContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_20 = context.hook;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::releaseParams((CallContext<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
                   *)&this_local);
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::getResults(&local_48,
               (CallContext<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
                *)&this_local,&local_60);
  builder._builder.capTable = (CapTableBuilder *)local_48._builder.data;
  builder._builder.segment = (SegmentBuilder *)local_48._builder.capTable;
  builder._builder.data = local_48._builder.pointers;
  builder._builder.pointers = (WirePointer *)local_48._builder._32_8_;
  builder._builder.dataSize = (int)in_stack_ffffffffffffff60;
  builder._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffff60 >> 0x30);
  initTestMessage(builder);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestExtendsImpl::grault(GraultContext context) {
  ++callCount;
  context.releaseParams();

  initTestMessage(context.getResults());

  return kj::READY_NOW;
}